

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

void XPMP2::RemoteAcRemove(Aircraft *ac)

{
  XPMPPlaneID XVar1;
  char cVar2;
  XPMPPlaneID local_1c;
  RmtDataEnqeueTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6> *local_18;
  
  cVar2 = glockRmtData[8];
  if (DAT_002cc79c == 2) {
    if (glockRmtData[8] == '\0') {
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)glockRmtData);
    }
    local_18 = (RmtDataEnqeueTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6> *)operator_new(0x10)
    ;
    XVar1 = ac->modeS_id;
    (local_18->super_RmtDataBaseTy).msgTy = RMT_MSG_AC_REMOVE;
    (local_18->super_RmtDataBaseTy)._vptr_RmtDataBaseTy = (_func_int **)&PTR__RmtDataBaseTy_002bd798
    ;
    *(XPMPPlaneID *)&(local_18->super_RmtDataBaseTy).field_0x9 = XVar1;
    std::__cxx11::
    list<std::unique_ptr<XPMP2::RmtDataBaseTy,std::default_delete<XPMP2::RmtDataBaseTy>>,std::allocator<std::unique_ptr<XPMP2::RmtDataBaseTy,std::default_delete<XPMP2::RmtDataBaseTy>>>>
    ::emplace_back<XPMP2::RmtDataEnqeueTy<XPMP2::RemoteAcRemoveTy,(XPMP2::RemoteMsgTy)6>*>
              ((list<std::unique_ptr<XPMP2::RmtDataBaseTy,std::default_delete<XPMP2::RmtDataBaseTy>>,std::allocator<std::unique_ptr<XPMP2::RmtDataBaseTy,std::default_delete<XPMP2::RmtDataBaseTy>>>>
                *)&gqueueRmtData_abi_cxx11_,&local_18);
    local_1c = ac->modeS_id;
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
    ::erase((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
             *)gmapRmtAcCache,&local_1c);
    if (cVar2 == '\0') {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)glockRmtData);
    }
  }
  else if (gmapRmtAcCache._40_8_ != 0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
    ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
             *)gmapRmtAcCache);
    return;
  }
  return;
}

Assistant:

void RemoteAcRemove (const Aircraft& ac)
{
    // Can only do anything reasonable if we are to send data
    if (glob.remoteStatus != REMOTE_SENDING) {
        if (!gmapRmtAcCache.empty())           // that's faster than searching for the individual plane...
            gmapRmtAcCache.clear();            // when we are not/no longer sending then the cache is outdated anyway
        return;
    }
    
    // We need the mutex to add to the queue
    bool bDidLock = false;                      // this isn't the most safe solution...but a recursive_mutex doesn't work with the condition variable used to notify the network thread
    if (!glockRmtData) {
        glockRmtData.lock();
        bDidLock = true;
    }
    
    // Add the plane id to the queue, marked for removal
    gqueueRmtData.emplace(new RmtDataAcRemoveTy(RemoteAcRemoveTy(ac.GetModeS_ID())));
    
    // Remove the plane from the cache
    gmapRmtAcCache.erase(ac.GetModeS_ID());
    
    // Undo the lock if we locked earlier
    if (bDidLock)
        glockRmtData.unlock();
}